

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  TokenType TVar1;
  char *__n;
  bool bVar2;
  bool bVar3;
  int iVar4;
  LogMessage *other;
  EnumDescriptor *this_00;
  EnumValueDescriptor *value_00;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  FieldDescriptor *pFVar8;
  byte bVar9;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  float value_01;
  int64 value;
  int64 int_value;
  string value_4;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120 [2];
  int64 local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_130._0_8_ = FieldDescriptor::TypeOnceInit;
    local_d0._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_130,
               (FieldDescriptor **)local_d0);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    bVar3 = ConsumeSignedInteger(this,(int64 *)local_130,0x7fffffff);
    if (bVar3) {
      if (*(int *)(field + 0x3c) == 3) {
        Reflection::AddInt32(reflection,message,field,local_130._0_4_);
      }
      else {
        Reflection::SetInt32(reflection,message,field,local_130._0_4_);
      }
      break;
    }
    goto LAB_002a9cd9;
  case 2:
    bVar3 = ConsumeSignedInteger(this,(int64 *)local_130,0x7fffffffffffffff);
    if (!bVar3) goto LAB_002a9cd9;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt64(reflection,message,field,local_130._0_8_);
    }
    else {
      Reflection::SetInt64(reflection,message,field,local_130._0_8_);
    }
    break;
  case 3:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)local_130,0xffffffff);
    if (!bVar3) goto LAB_002a9cd9;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt32(reflection,message,field,local_130._0_4_);
    }
    else {
      Reflection::SetUInt32(reflection,message,field,local_130._0_4_);
    }
    break;
  case 4:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)local_130,0xffffffffffffffff);
    if (!bVar3) goto LAB_002a9cd9;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt64(reflection,message,field,local_130._0_8_);
    }
    else {
      Reflection::SetUInt64(reflection,message,field,local_130._0_8_);
    }
    break;
  case 5:
    bVar3 = ConsumeDouble(this,(double *)local_130);
    if (!bVar3) goto LAB_002a9cd9;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddDouble(reflection,message,field,(double)local_130._0_8_);
    }
    else {
      Reflection::SetDouble(reflection,message,field,(double)local_130._0_8_);
    }
    break;
  case 6:
    bVar3 = ConsumeDouble(this,(double *)local_130);
    if (!bVar3) goto LAB_002a9cd9;
    iVar4 = *(int *)(field + 0x3c);
    value_01 = io::SafeDoubleToFloat((double)local_130._0_8_);
    if (iVar4 == 3) {
      Reflection::AddFloat(reflection,message,field,value_01);
    }
    else {
      Reflection::SetFloat(reflection,message,field,value_01);
    }
    break;
  case 7:
    if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
      bVar3 = ConsumeUnsignedInteger(this,(uint64 *)local_130,1);
      if (!bVar3) goto LAB_002a9cd9;
      if (*(int *)(field + 0x3c) == 3) {
        Reflection::AddBool(reflection,message,field,
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_130._0_8_ !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0);
      }
      else {
        Reflection::SetBool(reflection,message,field,
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_130._0_8_ !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0);
      }
      break;
    }
    local_130._8_8_ = (char *)0x0;
    local_120[0]._M_allocated_capacity = (ulong)(uint7)local_120[0]._1_7_ << 8;
    local_130._0_8_ = local_130 + 0x10;
    bVar3 = ConsumeIdentifier(this,(string *)local_130);
    if (bVar3) {
      iVar4 = std::__cxx11::string::compare(local_130);
      if (((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(local_130), iVar4 == 0)) ||
         (iVar4 = std::__cxx11::string::compare(local_130), iVar4 == 0)) {
        bVar3 = true;
      }
      else {
        iVar4 = std::__cxx11::string::compare(local_130);
        if (((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare(local_130), iVar4 != 0)) &&
           (iVar4 = std::__cxx11::string::compare(local_130), iVar4 != 0)) {
          std::operator+(&local_90,"Invalid value for boolean field \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
          psVar7 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_f0.field_2._M_allocated_capacity = *psVar7;
            local_f0.field_2._8_8_ = plVar6[3];
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar7;
            local_f0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_f0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::operator+(&local_b0,&local_f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
          pFVar8 = (FieldDescriptor *)(plVar6 + 2);
          if ((FieldDescriptor *)*plVar6 == pFVar8) {
            local_c0._M_allocated_capacity = *(undefined8 *)pFVar8;
            local_c0._8_8_ = plVar6[3];
            local_d0._0_8_ = (FieldDescriptor *)(local_d0 + 0x10);
          }
          else {
            local_c0._M_allocated_capacity = *(undefined8 *)pFVar8;
            local_d0._0_8_ = (FieldDescriptor *)*plVar6;
          }
          local_d0._8_8_ = plVar6[1];
          *plVar6 = (long)pFVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_d0);
          if ((FieldDescriptor *)local_d0._0_8_ != (FieldDescriptor *)(local_d0 + 0x10)) {
            operator_delete((void *)local_d0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          goto LAB_002a9cbf;
        }
        bVar3 = false;
      }
      if (*(int *)(field + 0x3c) == 3) {
        bVar2 = true;
        Reflection::AddBool(reflection,message,field,bVar3);
      }
      else {
        bVar2 = true;
        Reflection::SetBool(reflection,message,field,bVar3);
      }
    }
    else {
LAB_002a9cbf:
      bVar2 = false;
    }
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_);
    }
    if (!bVar2) goto LAB_002a9cd9;
    goto switchD_002a9222_default;
  case 8:
    local_d0._0_8_ = local_d0 + 0x10;
    local_d0._8_8_ = 0;
    local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffffffffff00;
    local_f8 = 0x7fffffffffffffff;
    this_00 = FieldDescriptor::enum_type(field);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar3 = ConsumeIdentifier(this,(string *)local_d0);
      if (!bVar3) goto LAB_002a9b97;
      value_00 = EnumDescriptor::FindValueByName(this_00,(string *)local_d0);
LAB_002a9845:
      if (value_00 == (EnumValueDescriptor *)0x0) {
        if ((local_f8 == 0x7fffffffffffffff) ||
           (bVar3 = Reflection::SupportsUnknownEnumValues(reflection), !bVar3)) {
          if (this->allow_unknown_enum_ == false) {
            std::operator+(&local_90,"Unknown enumeration value of \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0);
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
            psVar7 = puVar5 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_f0.field_2._M_allocated_capacity = *psVar7;
              local_f0.field_2._8_8_ = puVar5[3];
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            }
            else {
              local_f0.field_2._M_allocated_capacity = *psVar7;
              local_f0._M_dataplus._M_p = (pointer)*puVar5;
            }
            local_f0._M_string_length = puVar5[1];
            *puVar5 = psVar7;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            std::operator+(&local_b0,&local_f0,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            field);
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 == paVar11) {
              local_120[0]._0_8_ = paVar11->_M_allocated_capacity;
              local_120[0]._8_8_ = puVar5[3];
              local_130._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_130 + 0x10);
            }
            else {
              local_120[0]._0_8_ = paVar11->_M_allocated_capacity;
              local_130._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar5;
            }
            local_130._8_8_ = puVar5[1];
            *puVar5 = paVar11;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_130 + 0x10)) {
              operator_delete((void *)local_130._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_002a9b92;
            goto LAB_002a9b97;
          }
          std::operator+(&local_90,"Unknown enumeration value of \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0);
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
          psVar7 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_f0.field_2._M_allocated_capacity = *psVar7;
            local_f0.field_2._8_8_ = puVar5[3];
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar7;
            local_f0._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_f0._M_string_length = puVar5[1];
          *puVar5 = psVar7;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          std::operator+(&local_b0,&local_f0,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar11) {
            local_120[0]._0_8_ = paVar11->_M_allocated_capacity;
            local_120[0]._8_8_ = plVar6[3];
            local_130._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_130 + 0x10);
          }
          else {
            local_120[0]._0_8_ = paVar11->_M_allocated_capacity;
            local_130._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar6;
          }
          local_130._8_8_ = plVar6[1];
          *plVar6 = (long)paVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_130 + 0x10)) {
            operator_delete((void *)local_130._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          bVar3 = true;
          field = (FieldDescriptor *)0x1;
        }
        else {
          bVar3 = true;
          if (*(int *)(field + 0x3c) == 3) {
            Reflection::AddEnumValue(reflection,message,field,(int)local_f8);
            field = (FieldDescriptor *)0x1;
          }
          else {
            Reflection::SetEnumValue(reflection,message,field,(int)local_f8);
            field = (FieldDescriptor *)0x1;
          }
        }
      }
      else {
        if (*(int *)(field + 0x3c) == 3) {
          Reflection::AddEnum(reflection,message,field,value_00);
        }
        else {
          Reflection::SetEnum(reflection,message,field,value_00);
        }
        bVar3 = false;
      }
    }
    else {
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_130 + 0x10);
      local_130._0_8_ = paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"-","");
      __n = (char *)(this->tokenizer_).current_.text._M_string_length;
      if ((__n == (char *)local_130._8_8_) &&
         ((__n == (char *)0x0 ||
          (iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(void *)local_130._0_8_,
                        (size_t)__n), iVar4 == 0)))) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._0_8_ != paVar11) {
          operator_delete((void *)local_130._0_8_);
        }
LAB_002a97ac:
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_130 + 0x10);
        bVar3 = ConsumeSignedInteger(this,&local_f8,0x7fffffff);
        if (bVar3) {
          local_130._0_8_ = paVar11;
          local_130._8_8_ = FastInt64ToBufferLeft(local_f8,paVar11->_M_local_buf);
          local_130._8_8_ = local_130._8_8_ + -(long)paVar11;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,local_130._0_8_,(char *)(local_130._8_8_ + local_130._0_8_)
                    );
          std::__cxx11::string::operator=((string *)local_d0,(string *)&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          value_00 = EnumDescriptor::FindValueByNumber(this_00,(int)local_f8);
          goto LAB_002a9845;
        }
      }
      else {
        TVar1 = (this->tokenizer_).current_.type;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._0_8_ != paVar11) {
          operator_delete((void *)local_130._0_8_);
        }
        if (TVar1 == TYPE_INTEGER) goto LAB_002a97ac;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130,"Expected integer or identifier, got: ",
                       &(this->tokenizer_).current_.text);
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_130);
        local_90._M_dataplus._M_p = (pointer)local_130._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_130 + 0x10)) goto LAB_002a9b97;
LAB_002a9b92:
        operator_delete(local_90._M_dataplus._M_p);
      }
LAB_002a9b97:
      bVar3 = true;
      field = (FieldDescriptor *)0x0;
    }
    bVar9 = (byte)field;
    if ((FieldDescriptor *)local_d0._0_8_ != (FieldDescriptor *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_);
    }
    if (bVar3) goto LAB_002a9cdb;
    goto switchD_002a9222_default;
  case 9:
    local_130._8_8_ = (char *)0x0;
    local_120[0]._M_allocated_capacity = (ulong)(uint7)local_120[0]._1_7_ << 8;
    local_130._0_8_ = local_130 + 0x10;
    bVar3 = ConsumeString(this,(string *)local_130);
    if (bVar3) {
      if (*(int *)(field + 0x3c) == 3) {
        paVar11 = &local_50.field_2;
        local_50._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_130._0_8_,(char *)(local_130._8_8_ + local_130._0_8_));
        Reflection::AddString(reflection,message,field,&local_50);
        _Var10._M_p = local_50._M_dataplus._M_p;
      }
      else {
        paVar11 = &local_70.field_2;
        local_70._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_130._0_8_,(char *)(local_130._8_8_ + local_130._0_8_));
        Reflection::SetString(reflection,message,field,&local_70);
        _Var10._M_p = local_70._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != paVar11) {
        operator_delete(_Var10._M_p);
      }
    }
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_);
    }
    break;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_130,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x32c);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_130,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=((LogFinisher *)local_d0,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_130);
  default:
    goto switchD_002a9222_default;
  }
  if (bVar3 == false) {
LAB_002a9cd9:
    bVar9 = 0;
  }
  else {
switchD_002a9222_default:
    bVar9 = 1;
  }
LAB_002a9cdb:
  return (bool)(bVar9 & 1);
}

Assistant:

bool ConsumeFieldValue(Message* message, const Reflection* reflection,
                         const FieldDescriptor* field) {
// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                    \
  if (field->is_repeated()) {                        \
    reflection->Add##CPPTYPE(message, field, VALUE); \
  } else {                                           \
    reflection->Set##CPPTYPE(message, field, VALUE); \
  }

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        std::string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          std::string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name() +
                        "\". Value: \"" + value + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        std::string value;
        int64 int_value = kint64max;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = nullptr;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = StrCat(int_value);  // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier, got: " +
                      tokenizer_.current().text);
          return false;
        }

        if (enum_value == nullptr) {
          if (int_value != kint64max &&
              reflection->SupportsUnknownEnumValues()) {
            SET_FIELD(EnumValue, int_value);
            return true;
          } else if (!allow_unknown_enum_) {
            ReportError("Unknown enumeration value of \"" + value +
                        "\" for "
                        "field \"" +
                        field->name() + "\".");
            return false;
          } else {
            ReportWarning("Unknown enumeration value of \"" + value +
                          "\" for "
                          "field \"" +
                          field->name() + "\".");
            return true;
          }
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }